

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

ptr<buffer> __thiscall nuraft::inmem_log_store::pack(inmem_log_store *this,ulong index,int32 cnt)

{
  ulong uVar1;
  buffer *this_00;
  pointer psVar2;
  int iVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  int in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar6;
  shared_ptr<nuraft::buffer> *entry;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ptr<buffer> pVar8;
  ptr<log_entry> le;
  ptr<buffer> buf;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_> logs;
  ulong local_88;
  int local_7c;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined1 local_68 [16];
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_58;
  long local_38;
  
  local_88 = CONCAT44(in_register_00000014,cnt);
  local_58.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (long)in_ECX;
  uVar1 = local_38 + local_88;
  local_7c = in_ECX;
  if (local_88 < uVar1) {
    lVar6 = 0;
    do {
      local_78 = (element_type *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)(index + 0x38));
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      pmVar4 = std::
               map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
               ::operator[]((map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                             *)(index + 8),&local_88);
      local_78 = (pmVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_70,
                 &(pmVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      pthread_mutex_unlock((pthread_mutex_t *)(index + 0x38));
      log_entry::serialize((log_entry *)local_68);
      sVar5 = buffer::size((buffer *)local_68._0_8_);
      std::
      vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
      push_back(&local_58,(value_type *)local_68);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
      lVar6 = lVar6 + sVar5;
      local_88 = local_88 + 1;
    } while (local_88 < uVar1);
  }
  else {
    lVar6 = 0;
  }
  buffer::alloc((buffer *)this,lVar6 + local_38 * 4 + 4);
  buffer::pos((buffer *)(this->super_log_store)._vptr_log_store,0);
  buffer::put((buffer *)(this->super_log_store)._vptr_log_store,local_7c);
  psVar2 = local_58.
           super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_58.
                super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2; p_Var7 = p_Var7 + 1) {
    this_00 = (buffer *)(this->super_log_store)._vptr_log_store;
    sVar5 = buffer::size((buffer *)p_Var7->_vptr__Sp_counted_base);
    buffer::put(this_00,(int32)sVar5);
    buffer::put((buffer *)(this->super_log_store)._vptr_log_store,
                (buffer *)p_Var7->_vptr__Sp_counted_base);
  }
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector(&local_58);
  pVar8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> inmem_log_store::pack(ulong index, int32 cnt) {
    std::vector< ptr<buffer> > logs;

    size_t size_total = 0;
    for (ulong ii=index; ii<index+cnt; ++ii) {
        ptr<log_entry> le = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            le = logs_[ii];
        }
        assert(le.get());
        ptr<buffer> buf = le->serialize();
        size_total += buf->size();
        logs.push_back( buf );
    }

    ptr<buffer> buf_out = buffer::alloc
                          ( sizeof(int32) +
                            cnt * sizeof(int32) +
                            size_total );
    buf_out->pos(0);
    buf_out->put((int32)cnt);

    for (auto& entry: logs) {
        ptr<buffer>& bb = entry;
        buf_out->put((int32)bb->size());
        buf_out->put(*bb);
    }
    return buf_out;
}